

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

qint64 __thiscall QHttpNetworkReply::sizeNextBlock(QHttpNetworkReply *this)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0x1a0) != 0) {
    return *(long *)(*(long *)(lVar1 + 0x198) + 0x10) - *(long *)(lVar1 + 0x1b0);
  }
  return 0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }